

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmExtraCodeLiteGenerator::CreateProjectsByTarget_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmXMLWriter *xml)

{
  bool bVar1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  reference ppcVar2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *pvVar3;
  reference ppcVar4;
  char *pcVar5;
  string *psVar6;
  cmSystemTools *this_01;
  char *in_RCX;
  allocator local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string visualname;
  string relafilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string filename;
  string targetName;
  undefined1 local_88 [8];
  string outputDir;
  const_iterator cStack_60;
  TargetType type;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_58;
  const_iterator lt;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_48;
  const_iterator lg;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs;
  cmXMLWriter *xml_local;
  cmExtraCodeLiteGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *retval;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_48._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(this_00);
  do {
    lt._M_current =
         (cmGeneratorTarget **)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&lt);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_48);
    pvVar3 = cmLocalGenerator::GetGeneratorTargets(*ppcVar2);
    local_58._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(pvVar3);
    while( true ) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                ::operator*(&local_48);
      pvVar3 = cmLocalGenerator::GetGeneratorTargets(*ppcVar2);
      cStack_60 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                            (pvVar3);
      bVar1 = __gnu_cxx::operator!=(&local_58,&stack0xffffffffffffffa0);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_58);
      outputDir.field_2._12_4_ = cmGeneratorTarget::GetType(*ppcVar4);
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                ::operator*(&local_48);
      pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_88,pcVar5,(allocator *)(targetName.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(targetName.field_2._M_local_buf + 0xf));
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_58);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar4);
      std::__cxx11::string::string((string *)(filename.field_2._M_local_buf + 8),(string *)psVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&relafilename.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "/");
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&relafilename.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&filename.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_f0,".project");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)(relafilename.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)((long)&filename.field_2 + 8));
      this_01 = (cmSystemTools *)std::__cxx11::string::c_str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::RelativePath_abi_cxx11_
                ((string *)((long)&visualname.field_2 + 8),this_01,pcVar5,in_RCX);
      std::__cxx11::string::string
                ((string *)local_150,(string *)(filename.field_2._M_local_buf + 8));
      if (outputDir.field_2._12_4_ == 0) {
LAB_00709bb8:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_190,"Project",&local_191);
        cmXMLWriter::StartElement(xml,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"Name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"Path",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&visualname.field_2 + 8));
        cmXMLWriter::Attribute<char[3]>(xml,"Active",(char (*) [3])"No");
        cmXMLWriter::EndElement(xml);
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_58);
        CreateNewProjectFile(this,*ppcVar4,(string *)local_d0);
      }
      else if (outputDir.field_2._12_4_ - 1 < 3) {
        std::operator+(&local_170,"lib",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150);
        std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        goto LAB_00709bb8;
      }
      std::__cxx11::string::~string((string *)local_150);
      std::__cxx11::string::~string((string *)(visualname.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_88);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_58,0);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_48,0);
  } while( true );
}

Assistant:

std::vector<std::string> cmExtraCodeLiteGenerator::CreateProjectsByTarget(
  cmXMLWriter* xml)
{
  std::vector<std::string> retval;
  // for each target in the workspace create a codelite project
  const std::vector<cmLocalGenerator*>& lgs =
    this->GlobalGenerator->GetLocalGenerators();
  for (std::vector<cmLocalGenerator*>::const_iterator lg(lgs.begin());
       lg != lgs.end(); lg++) {
    for (std::vector<cmGeneratorTarget*>::const_iterator lt =
           (*lg)->GetGeneratorTargets().begin();
         lt != (*lg)->GetGeneratorTargets().end(); lt++) {
      cmStateEnums::TargetType type = (*lt)->GetType();
      std::string outputDir = (*lg)->GetCurrentBinaryDirectory();
      std::string targetName = (*lt)->GetName();
      std::string filename = outputDir + "/" + targetName + ".project";
      retval.push_back(targetName);
      // Make the project file relative to the workspace
      std::string relafilename = cmSystemTools::RelativePath(
        this->WorkspacePath.c_str(), filename.c_str());
      std::string visualname = targetName;
      switch (type) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
          visualname = "lib" + visualname;
          CM_FALLTHROUGH;
        case cmStateEnums::EXECUTABLE:
          xml->StartElement("Project");
          xml->Attribute("Name", visualname);
          xml->Attribute("Path", relafilename);
          xml->Attribute("Active", "No");
          xml->EndElement();

          CreateNewProjectFile(*lt, filename);
          break;
        default:
          break;
      }
    }
  }
  return retval;
}